

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FG_SolverMaxPlus.cpp
# Opt level: O2

double __thiscall FG_SolverMaxPlus::Solve(FG_SolverMaxPlus *this)

{
  int iVar1;
  size_t sVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  EDeadline *this_00;
  _List_node_base *p_Var8;
  char *fg;
  ulong uVar9;
  int iVar10;
  double dVar11;
  _List_node_base *local_600;
  Properties props;
  string local_5c0 [32];
  tms ts_after;
  tms ts_before;
  string local_560 [32];
  PropertyValue local_540 [2];
  undefined1 local_530 [376];
  MaxPlus mp;
  stringstream ss;
  ostream local_1a8 [376];
  
  times((tms *)&ts_before);
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &props.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  props.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       props.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"maxiter",(allocator<char> *)&ss)
  ;
  local_540[0].content = (placeholder *)operator_new(0x10);
  (local_540[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_005d5ba8;
  local_540[0].content[1]._vptr_placeholder = (_func_int **)(this->super_MaxPlusSolver)._m_maxiter;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,local_540);
  if (local_540[0].content != (placeholder *)0x0) {
    (*(local_540[0].content)->_vptr_placeholder[1])();
  }
  std::__cxx11::string::~string((string *)&mp);
  iVar1 = (this->super_MaxPlusSolver)._m_verbosity;
  iVar10 = 3;
  if (3 < iVar1) {
    iVar10 = iVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"verbose",(allocator<char> *)&ss)
  ;
  local_540[0].content = (placeholder *)operator_new(0x10);
  (local_540[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_005d5ba8;
  local_540[0].content[1]._vptr_placeholder = (_func_int **)(ulong)(iVar10 - 3);
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,local_540);
  if (local_540[0].content != (placeholder *)0x0) {
    (*(local_540[0].content)->_vptr_placeholder[1])();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"updates",(allocator<char> *)&ss)
  ;
  boost::any::any<std::__cxx11::string&>
            (local_540,&(this->super_MaxPlusSolver)._m_updateType,(type *)0x0,(type *)0x0);
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,local_540);
  if (local_540[0].content != (placeholder *)0x0) {
    (*(local_540[0].content)->_vptr_placeholder[1])();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"damping",(allocator<char> *)&ss)
  ;
  local_540[0].content = (placeholder *)operator_new(0x10);
  (local_540[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_005d5c58;
  local_540[0].content[1]._vptr_placeholder = (_func_int **)(this->super_MaxPlusSolver)._m_damping;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,local_540);
  if (local_540[0].content != (placeholder *)0x0) {
    (*(local_540[0].content)->_vptr_placeholder[1])();
  }
  std::__cxx11::string::~string((string *)&mp);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mp,"tol",(allocator<char> *)&ss);
  local_540[0].content = (placeholder *)operator_new(0x10);
  (local_540[0].content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_005d5c58;
  local_540[0].content[1]._vptr_placeholder = (_func_int **)0x3f847ae147ae147b;
  libDAI::Properties::Set(&props,(PropertyKey *)&mp,local_540);
  if (local_540[0].content != (placeholder *)0x0) {
    (*(local_540[0].content)->_vptr_placeholder[1])();
  }
  std::__cxx11::string::~string((string *)&mp);
  fg = (char *)(this->super_FG_Solver)._m_fg;
  libDAI::MaxPlus::MaxPlus(&mp,(FactorGraph *)fg,&props,(this->super_MaxPlusSolver)._m_nrSolutions);
  uVar9 = 0;
  do {
    if ((this->super_MaxPlusSolver)._m_nrRestarts <= uVar9) {
      std::__cxx11::
      list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator=(&(this->super_FG_Solver)._m_bestConfs,&mp._valConfs);
      sVar2 = (this->super_FG_Solver)._m_bestConfs.
              super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl._M_node._M_size;
      if (0 < (this->super_MaxPlusSolver)._m_verbosity) {
        poVar7 = std::operator<<((ostream *)&std::cout,"found ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7," configurations");
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      if (sVar2 == 0) {
        local_600 = (_List_node_base *)0x0;
      }
      else {
        p_Var3 = (this->super_FG_Solver)._m_bestConfs.
                 super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        local_600 = p_Var3[1]._M_next;
        if (1 < (this->super_MaxPlusSolver)._m_verbosity) {
          std::operator<<((ostream *)&std::cout,"best value:");
          poVar7 = std::ostream::_M_insert<double>((double)local_600);
          std::endl<char,std::char_traits<char>>(poVar7);
          if (2 < (this->super_MaxPlusSolver)._m_verbosity) {
            poVar7 = std::operator<<((ostream *)&std::cout,"best configuration:\n");
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            p_Var8 = p_Var3[1]._M_prev;
            p_Var4 = p_Var3[2]._M_next;
            std::operator<<(local_1a8,"< ");
            for (; p_Var8 != p_Var4; p_Var8 = (_List_node_base *)&p_Var8->_M_prev) {
              if (p_Var8 != p_Var3[1]._M_prev) {
                std::operator<<(local_1a8,", ");
              }
              std::__cxx11::stringstream::stringstream((stringstream *)local_540);
              std::ostream::_M_insert<unsigned_long>((ulong)local_530);
              std::__cxx11::stringbuf::str();
              std::__cxx11::stringstream::~stringstream((stringstream *)local_540);
              std::operator<<(local_1a8,local_560);
              std::__cxx11::string::~string(local_560);
            }
            std::operator<<(local_1a8," >");
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            poVar7 = std::operator<<(poVar7,local_5c0);
            std::endl<char,std::char_traits<char>>(poVar7);
            std::__cxx11::string::~string(local_5c0);
          }
        }
      }
      libDAI::MaxPlus::~MaxPlus(&mp);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                   *)&props);
      return (double)local_600;
    }
    if (3 < (this->super_MaxPlusSolver)._m_verbosity) {
      fg = "New MaxPlus restart...";
      std::operator<<((ostream *)&std::cout,"New MaxPlus restart...");
    }
    libDAI::MaxPlus::init(&mp,(EVP_PKEY_CTX *)fg);
    dVar11 = libDAI::MaxPlus::run(&mp);
    if (0.0 < this->_m_deadlineInSeconds) {
      times((tms *)&ts_after);
      lVar5 = ts_after.tms_utime - ts_before.tms_utime;
      lVar6 = sysconf(2);
      if (this->_m_deadlineInSeconds < (double)lVar5 / (double)lVar6) {
        this_00 = (EDeadline *)__cxa_allocate_exception(0x30);
        EDeadline::EDeadline(this_00,"MaxPlus deadline exceeded",0.0);
        __cxa_throw(this_00,&EDeadline::typeinfo,E::~E);
      }
    }
    if (3 < (this->super_MaxPlusSolver)._m_verbosity) {
      fg = "Found solution with value=";
      std::operator<<((ostream *)&std::cout,"Found solution with value=");
      poVar7 = std::ostream::_M_insert<double>(dVar11);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    uVar9 = (ulong)((int)uVar9 + 1);
  } while( true );
}

Assistant:

double FG_SolverMaxPlus::Solve()
{
    tms ts_before, ts_after;
    times(&ts_before);

    libDAI::Properties props;
    props.Set("maxiter",_m_maxiter);
    //cout <<"FG_SolverMaxPlus::Solve() - _m_verbosity="<<_m_verbosity<<endl;
    size_t verb = (size_t) std::max( (_m_verbosity-3), 0 );
    props.Set("verbose", verb);
    props.Set("updates",_m_updateType);
    props.Set("damping",_m_damping);
    double  tol = 1e-2;
    props.Set("tol",tol);    
    libDAI::MaxPlus mp (*_m_fg, props, _m_nrSolutions);
    for(Index restI=0; restI < _m_nrRestarts; restI++)
    {
        if(_m_verbosity >= 4)
            cout << "New MaxPlus restart...";

        mp.init();
        /* GetWriteAnyTimeResults, GetResultsOFStream, GetTimingsOFStream
           are defined by BayesianGameIdenticalPayoffSolver_T< JointPolicyPureVector >
           we do not really need this (at this point at least) so let's not bother for now
           ----------
           if(GetWriteAnyTimeResults())
            mp.SetAnyTimeResults(true,
                                 GetResultsOFStream(),
                                 GetTimingsOFStream());*/
        double value = mp.run();

        if(_m_deadlineInSeconds>0)
        {
            times(&ts_after);
            clock_t utime = ts_after.tms_utime -
                ts_before.tms_utime;
            double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
            if(timeSpentInS>_m_deadlineInSeconds)
                throw(EDeadline("MaxPlus deadline exceeded"));
        }
        if(_m_verbosity >= 4)
            cout << "Found solution with value="<<value<<endl;
    }

    //save the best configurations found by max-plus...
    //const std::vector<size_t> & config = mp.GetBestConfiguration();
    //we make a copy, when mp dies, its configs go with it...
    _m_bestConfs = mp.GetBestConfigurations();



    size_t nrConfsFound = _m_bestConfs.size();
    if(_m_verbosity >= 1)
        cout << "found "<< nrConfsFound <<" configurations"<<endl;

    double value = 0.0;
    if(nrConfsFound > 0)
    {
        libDAI::MADP_util::valConf& vc = _m_bestConfs.front();
        value = vc.first;
        std::vector<size_t>& sol_vec = vc.second;
        if(_m_verbosity >= 2)
            cout << "best value:"<<value<<endl;
        if(_m_verbosity >= 3)
            cout << "best configuration:\n"<<
                PrintTools::SoftPrintVector(sol_vec)<<endl;
        return (value);
    }
    else
        return(0.0);

}